

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkPipelineStageFlags Diligent::ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE StateFlags)

{
  type StateFlag;
  VkAccessFlags VVar1;
  Char *Message;
  uint local_40;
  RESOURCE_STATE StateBit;
  VkAccessFlags AccessFlags;
  undefined1 local_30 [8];
  string msg;
  RESOURCE_STATE StateFlags_local;
  
  msg.field_2._12_4_ = StateFlags;
  if ((RESOURCE_STATE_MAX_BIT|RESOURCE_STATE_COMMON|RESOURCE_STATE_RAY_TRACING|
       RESOURCE_STATE_BUILD_AS_WRITE|RESOURCE_STATE_BUILD_AS_READ|RESOURCE_STATE_PRESENT|
       RESOURCE_STATE_INPUT_ATTACHMENT|RESOURCE_STATE_RESOLVE_SOURCE|RESOURCE_STATE_RESOLVE_DEST|
       RESOURCE_STATE_COPY_SOURCE|RESOURCE_STATE_COPY_DEST|RESOURCE_STATE_INDIRECT_ARGUMENT|
       RESOURCE_STATE_STREAM_OUT|RESOURCE_STATE_SHADER_RESOURCE|RESOURCE_STATE_DEPTH_READ|
       RESOURCE_STATE_DEPTH_WRITE|RESOURCE_STATE_UNORDERED_ACCESS|RESOURCE_STATE_RENDER_TARGET|
       RESOURCE_STATE_INDEX_BUFFER|RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER|
      RESOURCE_STATE_UNDEFINED) < StateFlags) {
    FormatString<char[38]>
              ((string *)local_30,(char (*) [38])"Resource state flags are out of range");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ResourceStateFlagsToVkAccessFlags",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x524);
    std::__cxx11::string::~string((string *)local_30);
  }
  local_40 = 0;
  while (msg.field_2._12_4_ != 0) {
    StateFlag = ExtractLSB<Diligent::RESOURCE_STATE>
                          ((RESOURCE_STATE *)(msg.field_2._M_local_buf + 0xc));
    VVar1 = ResourceStateFlagToVkAccessFlags(StateFlag);
    local_40 = VVar1 | local_40;
  }
  return local_40;
}

Assistant:

VkPipelineStageFlags ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE StateFlags)
{
    VERIFY(Uint32{StateFlags} < (RESOURCE_STATE_MAX_BIT << 1), "Resource state flags are out of range");

    VkAccessFlags AccessFlags = 0;
    while (StateFlags != RESOURCE_STATE_UNKNOWN)
    {
        RESOURCE_STATE StateBit = ExtractLSB(StateFlags);
        AccessFlags |= ResourceStateFlagToVkAccessFlags(StateBit);
    }
    return AccessFlags;
}